

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall
re2::FlattenedProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,int start)

{
  Inst *this_00;
  long lVar1;
  ulong uVar2;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (ulong)(int)prog;
  lVar1 = uVar2 * 8;
  for (; (long)uVar2 < (long)*(int *)(this + 0x10); uVar2 = uVar2 + 1) {
    this_00 = (Inst *)(*(long *)(this + 0x60) + lVar1);
    if ((*(byte *)(*(long *)(this + 0x60) + lVar1) & 8) == 0) {
      Prog::Inst::Dump_abi_cxx11_(&local_70,this_00);
      StringPrintf_abi_cxx11_(&local_50,"%d+ %s\n",uVar2 & 0xffffffff,local_70._M_dataplus._M_p);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      Prog::Inst::Dump_abi_cxx11_(&local_70,this_00);
      StringPrintf_abi_cxx11_(&local_50,"%d. %s\n",uVar2 & 0xffffffff,local_70._M_dataplus._M_p);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    lVar1 = lVar1 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string FlattenedProgToString(Prog* prog, int start) {
  std::string s;
  for (int id = start; id < prog->size(); id++) {
    Prog::Inst* ip = prog->inst(id);
    if (ip->last())
      s += StringPrintf("%d. %s\n", id, ip->Dump().c_str());
    else
      s += StringPrintf("%d+ %s\n", id, ip->Dump().c_str());
  }
  return s;
}